

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_fe.cc
# Opt level: O0

ElemMat * __thiscall
lf::uscalfe::LinearFELaplaceElementMatrix::Eval
          (ElemMat *__return_storage_ptr__,LinearFELaplaceElementMatrix *this,Entity *cell)

{
  double dVar1;
  double dVar2;
  double dVar3;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  source_loc loc_03;
  source_loc loc_04;
  format_string_t<const_Eigen::PartialReduxExpr<Eigen::Block<Eigen::Matrix<double,_4,_4>_>,_Eigen::internal::member_sum<double,_double>,_0>,_const_Eigen::Transpose<const_Eigen::PartialReduxExpr<Eigen::Block<Eigen::Matrix<double,_4,_4>_>,_Eigen::internal::member_sum<double,_double>,_1>_>_>
  fmt;
  format_string_t<Eigen::Block<Eigen::Matrix<double,_4,_4>_>_> fmt_00;
  format_string_t<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>,_const_Eigen::Matrix<double,_2,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_2>_>_>,_Eigen::Matrix<double,__1,__1>_>
  fmt_01;
  format_string_t<double,_Eigen::Matrix<double,__1,_1>_> fmt_02;
  format_string_t<const_double_&,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1>_>_>
  fmt_03;
  format_string_t<const_lf::base::RefEl_&,_Eigen::Matrix<double,__1,__1>_&> fmt_04;
  long *plVar4;
  RefElType RVar5;
  int iVar6;
  undefined4 extraout_var;
  MatrixXd *pMVar7;
  __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var8;
  element_type *peVar9;
  Index IVar10;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar11;
  MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *other;
  Scalar *pSVar12;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar13;
  Matrix<double,_3,_1,_0,_3,_1> *other_00;
  const_reference other_01;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Transpose<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>,_0>
  PVar14;
  Product<Eigen::Transpose<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>,_Eigen::Matrix<double,_2,_4,_0,_2,_4>,_0>
  PVar15;
  Type local_1548;
  RowwiseReturnType local_1510;
  SumReturnType local_14d8;
  ConstTransposeReturnType local_1498;
  Type local_1458;
  ColwiseReturnType local_1420;
  SumReturnType local_13e8;
  char *local_13a8;
  size_t local_13a0;
  source_loc local_1398;
  Type local_1380;
  char *local_1348;
  size_t local_1340;
  source_loc local_1338;
  Index local_1320;
  Index nv;
  string local_1310;
  allocator<char> local_12e9;
  string local_12e8;
  allocator<char> local_12c1;
  string local_12c0;
  string local_12a0;
  allocator<char> local_1279;
  string local_1278;
  allocator<char> local_1251;
  string local_1250;
  stringstream local_1230 [8];
  stringstream ss_4;
  ostream local_1220 [376];
  Scalar local_10a8;
  double local_10a0;
  non_const_type local_1098;
  Product<Eigen::Transpose<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>,_Eigen::Matrix<double,_2,_4,_0,_2,_4>,_0>
  local_1090;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>,_Eigen::Matrix<double,_2,_4,_0,_2,_4>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_1080;
  Matrix<double,_4,_2,_0,_4,_2> local_1058;
  non_const_type local_1010;
  Matrix<double,_2,_2,_0,_2,_2> local_1008;
  Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Transpose<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>,_0>
  local_fe8;
  Matrix<double,2,4,0,2,4> local_fd8 [8];
  Matrix<double,_2,_4,_0,_2,_4> gradmat;
  Vector2d qp;
  undefined1 local_f80 [4];
  int q;
  Matrix<double,__1,__1,_0,__1,__1> local_f68;
  double local_f50;
  Matrix<double,_2,_2,_0,_2,_2> local_f48;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_f20;
  char *local_f00;
  size_t local_ef8;
  source_loc local_ef0;
  anon_class_8_1_54a397e7 local_ed8;
  anon_class_8_1_54a397e7 DPhiadj;
  Matrix<double,__1,_1,_0,__1,_1> local_eb8;
  double local_ea8;
  char *local_ea0;
  size_t local_e98;
  source_loc local_e90;
  anon_class_8_1_898aabae local_e78;
  anon_class_8_1_898aabae detDPhi;
  double local_e68;
  double local_e60;
  Matrix<double,_3,_1,_0,_3,_1> local_e58;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_e40;
  undefined1 local_e20 [8];
  Vector3d detc;
  Scalar local_e00;
  Scalar local_df8;
  Scalar local_df0;
  Scalar local_de8;
  Scalar local_de0;
  Scalar local_dd8;
  Scalar local_dd0;
  Scalar local_dc8;
  Scalar local_dc0;
  Scalar local_db8;
  Scalar local_db0;
  Scalar local_da8;
  Scalar local_da0;
  Scalar local_d98;
  Scalar local_d90;
  Matrix<double,_4,_4,_0,_4,_4> local_d88;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_d08;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_ce8;
  undefined1 local_cd8 [8];
  Matrix<double,_2,_4,_0,_2,_4> G;
  allocator<char> local_c89;
  string local_c88;
  allocator<char> local_c61;
  string local_c60;
  allocator<char> local_c39;
  string local_c38;
  string local_c18;
  allocator<char> local_bf1;
  string local_bf0;
  allocator<char> local_bc9;
  string local_bc8;
  stringstream local_ba8 [8];
  stringstream ss_3;
  ostream local_b98 [376];
  Type local_a20;
  non_const_type local_9f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_2,_1,_3,_2>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>
  local_9e8;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_2,_1,_3,_2>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0>
  local_9c0;
  XprTypeNested local_990;
  Type local_988;
  Matrix<double,2,3,0,2,3> local_968 [8];
  Matrix<double,_2,_3,_0,_2,_3> grad_bary_coords;
  Matrix<double,__1,__1,_0,__1,__1> local_930;
  Matrix<double,__1,_1,_0,__1,_1> local_918;
  double local_908;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_900;
  char *local_8d0;
  size_t local_8c8;
  source_loc local_8c0;
  double local_8a8;
  double area;
  non_const_type local_870;
  Type local_868;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_838 [16];
  undefined1 local_828 [8];
  Matrix<double,_3,_3,_0,_3,_3> X;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  allocator<char> local_789;
  string local_788;
  string local_768;
  allocator<char> local_741;
  string local_740;
  allocator<char> local_719;
  string local_718;
  stringstream local_6f8 [8];
  stringstream ss_2;
  ostream local_6e8 [376];
  ConstantReturnType local_570;
  char *local_560;
  undefined8 local_558;
  source_loc local_550;
  undefined1 local_538 [8];
  MatrixXd vertices;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  stringstream local_438 [8];
  stringstream ss_1;
  ostream local_428 [383];
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  long *local_30;
  Geometry *geo_ptr;
  Entity *pEStack_20;
  RefEl ref_el;
  Entity *cell_local;
  LinearFELaplaceElementMatrix *this_local;
  ElemMat *elem_mat;
  
  pEStack_20 = cell;
  iVar6 = (*cell->_vptr_Entity[4])();
  geo_ptr._7_1_ = (undefined1)iVar6;
  iVar6 = (*pEStack_20->_vptr_Entity[3])();
  local_30 = (long *)CONCAT44(extraout_var,iVar6);
  if (local_30 == (long *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::operator<<(local_1a8,"Invalid geometry!");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"geo_ptr != nullptr",&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
               ,&local_211);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e8,&local_210,0x2f,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"false",&local_259);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
               ,&local_281);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"",&local_2a9);
    lf::base::AssertionFailed(&local_258,&local_280,0x2f,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    abort();
  }
  iVar6 = (**(code **)(*local_30 + 8))();
  if (iVar6 == 2) {
    iVar6 = (**(code **)*local_30)();
    plVar4 = local_30;
    if (iVar6 == 2) {
      pMVar7 = lf::base::RefEl::NodeCoords((RefEl *)((long)&geo_ptr + 7));
      (**(code **)(*plVar4 + 0x18))(local_538,plVar4,pMVar7);
      p_Var8 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               Logger();
      peVar9 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var8);
      spdlog::source_loc::source_loc
                (&local_550,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                 ,0x35,"Eval");
      local_560 = "{}, shape={}";
      local_558 = 0xc;
      fmt_04.str_.size_ = 0xc;
      fmt_04.str_.data_ = "{}, shape={}";
      loc.line = local_550.line;
      loc._12_4_ = local_550._12_4_;
      loc.filename = local_550.filename;
      loc.funcname = local_550.funcname;
      spdlog::logger::log<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                (peVar9,loc,trace,fmt_04,(RefEl *)((long)&geo_ptr + 7),
                 (Matrix<double,__1,__1,_0,__1,__1> *)local_538);
      Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Zero(&local_570,4,4);
      Eigen::Matrix<double,4,4,0,4,4>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
                ((Matrix<double,4,4,0,4,4> *)__return_storage_ptr__,
                 (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                  *)&local_570);
      RVar5 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&geo_ptr + 7));
      if (RVar5 == kTria) {
        IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                           ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_538)
        ;
        if (IVar10 == 3) {
          IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                             ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                              local_538);
          if (IVar10 == 2) {
            Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_828)
            ;
            Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Ones();
            Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<3,1>(&local_868,local_828,0,0);
            Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,false>::operator=
                      ((Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,false> *)&local_868,local_838);
            local_870 = (non_const_type)
                        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                                  ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_538
                                  );
            Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<3,2>
                      ((Type *)&area,local_828,0,1);
            Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,2,false>::operator=
                      ((Block<Eigen::Matrix<double,3,3,0,3,3>,3,2,false> *)&area,
                       (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                       &local_870);
            this_00 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_828;
            Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::determinant(this_00);
            std::abs((int)this_00);
            local_8a8 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) * 0.5;
            p_Var8 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)Logger();
            peVar9 = std::
                     __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(p_Var8);
            spdlog::source_loc::source_loc
                      (&local_8c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                       ,0x4b,"Eval");
            plVar4 = local_30;
            local_8d0 = "Area: {} <-> {}";
            local_8c8 = 0xf;
            local_908 = 0.5;
            Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)&local_930,
                       (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&this->kTriabc);
            (**(code **)(*plVar4 + 0x30))(&local_918,plVar4,&local_930);
            Eigen::operator*(&local_900,&local_908,(StorageBaseType *)&local_918);
            fmt_03.str_.size_ = local_8c8;
            fmt_03.str_.data_ = local_8d0;
            loc_00.line = local_8c0.line;
            loc_00._12_4_ = local_8c0._12_4_;
            loc_00.filename = local_8c0.filename;
            loc_00.funcname = local_8c0.funcname;
            spdlog::logger::
            log<double_const&,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>
                      (peVar9,loc_00,trace,fmt_03,&local_8a8,&local_900);
            Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_918);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_930);
            local_990 = (XprTypeNested)
                        Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::inverse
                                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_828);
            Eigen::DenseBase<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>>::block<2,3>
                      (&local_988,&local_990,1,0);
            Eigen::Matrix<double,2,3,0,2,3>::
            Matrix<Eigen::Block<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>const,2,3,false>>
                      (local_968,&local_988);
            local_9f0 = (non_const_type)
                        Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::transpose
                                  ((DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)local_968);
            Eigen::operator*(&local_9e8,&local_8a8,(StorageBaseType *)&local_9f0);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,2,1,3,2>const>const,Eigen::Transpose<Eigen::Matrix<double,2,3,0,2,3>>const>>
            ::operator*(&local_9c0,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,2,1,3,2>const>const,Eigen::Transpose<Eigen::Matrix<double,2,3,0,2,3>>const>>
                         *)&local_9e8,(MatrixBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)local_968
                       );
            Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::block<3,3>
                      (&local_a20,
                       (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)__return_storage_ptr__,0,0);
            Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,3,false>::operator=
                      ((Block<Eigen::Matrix<double,4,4,0,4,4>,3,3,false> *)&local_a20,
                       (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_2,_1,_3,_2>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0>_>
                        *)&local_9c0);
            goto LAB_00719469;
          }
        }
        std::__cxx11::stringstream::stringstream(local_6f8);
        std::operator<<(local_6e8,"Wrong size of vertex matrix!");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_718,"(vertices.cols() == 3) && (vertices.rows() == 2)",
                   &local_719);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_740,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                   ,&local_741);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_718,&local_740,0x42,&local_768);
        std::__cxx11::string::~string((string *)&local_768);
        std::__cxx11::string::~string((string *)&local_740);
        std::allocator<char>::~allocator(&local_741);
        std::__cxx11::string::~string((string *)&local_718);
        std::allocator<char>::~allocator(&local_719);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"false",&local_789);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                   ,&local_7b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7d8,"",
                   (allocator<char> *)
                   ((long)X.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + 0x47));
        lf::base::AssertionFailed(&local_788,&local_7b0,0x42,&local_7d8);
        std::__cxx11::string::~string((string *)&local_7d8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)X.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + 0x47));
        std::__cxx11::string::~string((string *)&local_7b0);
        std::allocator<char>::~allocator(&local_7b1);
        std::__cxx11::string::~string((string *)&local_788);
        std::allocator<char>::~allocator(&local_789);
        abort();
      }
      if (RVar5 != kQuad) {
        std::__cxx11::stringstream::stringstream(local_1230);
        std::operator<<(local_1220,"Illegal cell type");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1250,"false",&local_1251);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1278,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                   ,&local_1279);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_1250,&local_1278,0x96,&local_12a0);
        std::__cxx11::string::~string((string *)&local_12a0);
        std::__cxx11::string::~string((string *)&local_1278);
        std::allocator<char>::~allocator(&local_1279);
        std::__cxx11::string::~string((string *)&local_1250);
        std::allocator<char>::~allocator(&local_1251);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_12c0,"false",&local_12c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_12e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                   ,&local_12e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1310,"",(allocator<char> *)((long)&nv + 7));
        lf::base::AssertionFailed(&local_12c0,&local_12e8,0x96,&local_1310);
        std::__cxx11::string::~string((string *)&local_1310);
        std::allocator<char>::~allocator((allocator<char> *)((long)&nv + 7));
        std::__cxx11::string::~string((string *)&local_12e8);
        std::allocator<char>::~allocator(&local_12e9);
        std::__cxx11::string::~string((string *)&local_12c0);
        std::allocator<char>::~allocator(&local_12c1);
        abort();
      }
      IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                         ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_538);
      if (IVar10 == 4) {
        IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                           ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_538)
        ;
        if (IVar10 == 2) {
          Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix(&local_d88);
          local_d90 = 1.0;
          Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator<<
                    (&local_d08,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_d88,
                     &local_d90);
          local_d98 = -1.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (&local_d08,&local_d98);
          local_da0 = -1.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,&local_da0);
          local_da8 = 1.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,&local_da8);
          local_db0 = 0.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,&local_db0);
          local_db8 = 1.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,&local_db8);
          local_dc0 = 0.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,&local_dc0);
          local_dc8 = -1.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,&local_dc8);
          local_dd0 = 0.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,&local_dd0);
          local_dd8 = 0.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,&local_dd8);
          local_de0 = 0.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,&local_de0);
          local_de8 = 1.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,&local_de8);
          local_df0 = 0.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,&local_df0);
          local_df8 = 0.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,&local_df8);
          local_e00 = 1.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,&local_e00);
          detc.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] = -1.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar11,detc.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                       m_storage.m_data.array + 2);
          other = (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::finished(pCVar11);
          local_ce8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                                ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_538,other)
          ;
          Eigen::Matrix<double,2,4,0,2,4>::
          Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                    ((Matrix<double,2,4,0,2,4> *)local_cd8,&local_ce8);
          Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::~CommaInitializer
                    (&local_d08);
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_e58);
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1> *)local_cd8
                               ,0,1);
          dVar1 = *pSVar12;
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1> *)local_cd8
                               ,1,2);
          dVar2 = *pSVar12;
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1> *)local_cd8
                               ,1,1);
          dVar3 = *pSVar12;
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1> *)local_cd8
                               ,0,2);
          local_e60 = dVar1 * dVar2 - dVar3 * *pSVar12;
          Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
                    (&local_e40,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_e58,
                     &local_e60);
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1> *)local_cd8
                               ,0,1);
          dVar1 = *pSVar12;
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1> *)local_cd8
                               ,1,3);
          dVar2 = *pSVar12;
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1> *)local_cd8
                               ,1,1);
          dVar3 = *pSVar12;
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1> *)local_cd8
                               ,0,3);
          local_e68 = dVar1 * dVar2 - dVar3 * *pSVar12;
          pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                              (&local_e40,&local_e68);
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1> *)local_cd8
                               ,1,2);
          dVar1 = *pSVar12;
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1> *)local_cd8
                               ,0,3);
          dVar2 = *pSVar12;
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1> *)local_cd8
                               ,0,2);
          dVar3 = *pSVar12;
          pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_1> *)local_cd8
                               ,1,3);
          detDPhi.detc = (Vector3d *)(dVar1 * dVar2 - dVar3 * *pSVar12);
          pCVar13 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                              (pCVar13,(Scalar *)&detDPhi);
          other_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
                               (pCVar13);
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                    ((Matrix<double,_3,_1,_0,_3,_1> *)local_e20,other_00);
          Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
                    (&local_e40);
          local_e78.detc = (Vector3d *)local_e20;
          p_Var8 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar9 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var8);
          spdlog::source_loc::source_loc
                    (&local_e90,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                     ,0x72,"Eval");
          local_ea0 = "Determinant: {} <-> {}";
          local_e98 = 0x16;
          local_ea8 = Eval::anon_class_8_1_898aabae::operator()(&local_e78,&this->kQuadpt);
          plVar4 = local_30;
          Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
                    ((Matrix<double,_1,_1,0,_1,_1> *)&DPhiadj,
                     (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&this->kQuadpt);
          (**(code **)(*plVar4 + 0x30))(&local_eb8,plVar4,&DPhiadj);
          fmt_02.str_.size_ = local_e98;
          fmt_02.str_.data_ = local_ea0;
          loc_01.line = local_e90.line;
          loc_01._12_4_ = local_e90._12_4_;
          loc_01.filename = local_e90.filename;
          loc_01.funcname = local_e90.funcname;
          spdlog::logger::log<double,Eigen::Matrix<double,_1,1,0,_1,1>>
                    (peVar9,loc_01,debug,fmt_02,&local_ea8,&local_eb8);
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_eb8);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)&DPhiadj);
          local_ed8.G = (Matrix<double,_2,_4,_0,_2,_4> *)local_cd8;
          p_Var8 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar9 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var8);
          spdlog::source_loc::source_loc
                    (&local_ef0,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                     ,0x81,"Eval");
          local_f00 = "InverseTransposedJacobian:\n{} <-> {}";
          local_ef8 = 0x24;
          Eval::anon_class_8_1_54a397e7::operator()(&local_f48,&local_ed8,&this->kQuadpt);
          local_f50 = Eval::anon_class_8_1_898aabae::operator()(&local_e78,&this->kQuadpt);
          Eigen::MatrixBase<Eigen::Matrix<double,2,2,0,2,2>>::operator/
                    (&local_f20,(MatrixBase<Eigen::Matrix<double,2,2,0,2,2>> *)&local_f48,&local_f50
                    );
          plVar4 = local_30;
          Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
                    ((Matrix<double,_1,_1,0,_1,_1> *)local_f80,
                     (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&this->kQuadpt);
          (**(code **)(*plVar4 + 0x28))(&local_f68,plVar4,local_f80);
          fmt_01.str_.size_ = local_ef8;
          fmt_01.str_.data_ = local_f00;
          loc_02.line = local_ef0.line;
          loc_02._12_4_ = local_ef0._12_4_;
          loc_02.filename = local_ef0.filename;
          loc_02.funcname = local_ef0.funcname;
          spdlog::logger::
          log<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,2,2,0,2,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,2,0,2,2>const>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    (peVar9,loc_02,trace,fmt_01,&local_f20,&local_f68);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_f68);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_f80);
          for (qp.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
               array[1]._4_4_ = 0;
              qp.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
              [1]._4_4_ < 4;
              qp.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
              [1]._4_4_ = qp.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                          m_data.array[1]._4_4_ + 1) {
            other_01 = std::array<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_4UL>::operator[]
                                 (&this->kQuadPoints,
                                  (long)qp.
                                        super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                                        .m_storage.m_data.array[1]._4_4_);
            Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
                      ((Matrix<double,_2,_1,_0,_2,_1> *)
                       (gradmat.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.
                        m_storage.m_data.array + 7),other_01);
            Eval::anon_class_8_1_54a397e7::operator()
                      (&local_1008,&local_ed8,
                       (Vector2d *)
                       (gradmat.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.
                        m_storage.m_data.array + 7));
            DervRefShapFncts(&local_1058,
                             (Vector2d *)
                             (gradmat.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.
                              m_storage.m_data.array + 7));
            local_1010 = (non_const_type)
                         Eigen::DenseBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::transpose
                                   ((DenseBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_> *)&local_1058)
            ;
            PVar14 = Eigen::MatrixBase<Eigen::Matrix<double,2,2,0,2,2>>::operator*
                               ((MatrixBase<Eigen::Matrix<double,2,2,0,2,2>> *)&local_1008,
                                (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>_>
                                 *)&local_1010);
            local_fe8 = PVar14;
            Eigen::Matrix<double,2,4,0,2,4>::
            Matrix<Eigen::Product<Eigen::Matrix<double,2,2,0,2,2>,Eigen::Transpose<Eigen::Matrix<double,4,2,0,4,2>>,0>>
                      (local_fd8,&local_fe8);
            local_1098 = (non_const_type)
                         Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::transpose
                                   ((DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)local_fd8);
            PVar15 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,2,4,0,2,4>>>::operator*
                               ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,2,4,0,2,4>>> *)
                                &local_1098,
                                (MatrixBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)local_fd8);
            local_1090 = PVar15;
            local_10a0 = Eval::anon_class_8_1_898aabae::operator()
                                   (&local_e78,
                                    (Vector2d *)
                                    (gradmat.
                                     super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.
                                     m_storage.m_data.array + 7));
            Eigen::
            MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,2,4,0,2,4>>,Eigen::Matrix<double,2,4,0,2,4>,0>>
            ::operator/(&local_1080,
                        (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,2,4,0,2,4>>,Eigen::Matrix<double,2,4,0,2,4>,0>>
                         *)&local_1090,&local_10a0);
            Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator+=
                      ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)__return_storage_ptr__,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>,_Eigen::Matrix<double,_2,_4,_0,_2,_4>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>_>
                        *)&local_1080);
          }
          local_10a8 = 0.25;
          Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator*=
                    ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)__return_storage_ptr__,
                     &local_10a8);
LAB_00719469:
          local_1320 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                                 ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                  local_538);
          p_Var8 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar9 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var8);
          spdlog::source_loc::source_loc
                    (&local_1338,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                     ,0x9c,"Eval");
          local_1348 = "Element matrix\n{}";
          local_1340 = 0x11;
          Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::block<long,long>
                    (&local_1380,
                     (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)__return_storage_ptr__,0,0,
                     local_1320,local_1320);
          fmt_00.str_.size_ = local_1340;
          fmt_00.str_.data_ = local_1348;
          loc_03.line = local_1338.line;
          loc_03._12_4_ = local_1338._12_4_;
          loc_03.filename = local_1338.filename;
          loc_03.funcname = local_1338.funcname;
          spdlog::logger::log<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
                    (peVar9,loc_03,trace,fmt_00,&local_1380);
          p_Var8 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar9 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var8);
          spdlog::source_loc::source_loc
                    (&local_1398,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                     ,0x9f,"Eval");
          local_13a8 = "Row sums = {},\ncol sums = {}";
          local_13a0 = 0x1c;
          Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::block<long,long>
                    (&local_1458,
                     (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)__return_storage_ptr__,0,0,
                     local_1320,local_1320);
          Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::
          colwise(&local_1420,
                  (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                  &local_1458);
          Eigen::VectorwiseOp<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
          ::sum(&local_13e8,&local_1420);
          Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::block<long,long>
                    (&local_1548,
                     (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)__return_storage_ptr__,0,0,
                     local_1320,local_1320);
          Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::
          rowwise(&local_1510,
                  (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                  &local_1548);
          Eigen::VectorwiseOp<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1>
          ::sum(&local_14d8,&local_1510);
          Eigen::
          DenseBase<Eigen::PartialReduxExpr<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_Eigen::internal::member_sum<double,_double>,_1>_>
          ::transpose(&local_1498,
                      (DenseBase<Eigen::PartialReduxExpr<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::internal::member_sum<double,_double>,_1>_>
                       *)&local_14d8);
          fmt.str_.size_ = local_13a0;
          fmt.str_.data_ = local_13a8;
          loc_04.line = local_1398.line;
          loc_04._12_4_ = local_1398._12_4_;
          loc_04.filename = local_1398.filename;
          loc_04.funcname = local_1398.funcname;
          spdlog::logger::
          log<Eigen::PartialReduxExpr<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::internal::member_sum<double,double>,0>const,Eigen::Transpose<Eigen::PartialReduxExpr<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::internal::member_sum<double,double>,1>const>const>
                    (peVar9,loc_04,trace,fmt,&local_13e8,&local_1498);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_538);
          return __return_storage_ptr__;
        }
      }
      std::__cxx11::stringstream::stringstream(local_ba8);
      std::operator<<(local_b98,"Wrong size of vertex matrix!");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bc8,"(vertices.cols() == 4) && (vertices.rows() == 2)",&local_bc9)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bf0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                 ,&local_bf1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_bc8,&local_bf0,0x58,&local_c18);
      std::__cxx11::string::~string((string *)&local_c18);
      std::__cxx11::string::~string((string *)&local_bf0);
      std::allocator<char>::~allocator(&local_bf1);
      std::__cxx11::string::~string((string *)&local_bc8);
      std::allocator<char>::~allocator(&local_bc9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c38,"false",&local_c39);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c60,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
                 ,&local_c61);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c88,"",&local_c89);
      lf::base::AssertionFailed(&local_c38,&local_c60,0x58,&local_c88);
      std::__cxx11::string::~string((string *)&local_c88);
      std::allocator<char>::~allocator(&local_c89);
      std::__cxx11::string::~string((string *)&local_c60);
      std::allocator<char>::~allocator(&local_c61);
      std::__cxx11::string::~string((string *)&local_c38);
      std::allocator<char>::~allocator(&local_c39);
      abort();
    }
  }
  std::__cxx11::stringstream::stringstream(local_438);
  std::operator<<(local_428,"Only 2D implementation available!");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"(geo_ptr->DimGlobal() == 2) && (geo_ptr->DimLocal() == 2)",
             &local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
             ,&local_481);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_458,&local_480,0x31,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"false",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lin_fe.cc"
             ,&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"",
             (allocator<char> *)
             ((long)&vertices.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols + 7));
  lf::base::AssertionFailed(&local_4c8,&local_4f0,0x31,&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&vertices.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols + 7));
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  abort();
}

Assistant:

LinearFELaplaceElementMatrix::ElemMat LinearFELaplaceElementMatrix::Eval(
    const lf::mesh::Entity &cell) const {
  // Topological type of the cell
  const lf::base::RefEl ref_el{cell.RefEl()};

  // Obtain the vertex coordinates of the cell, which completely
  // describe its shape.
  const lf::geometry::Geometry *geo_ptr = cell.Geometry();
  LF_ASSERT_MSG(geo_ptr != nullptr, "Invalid geometry!");
  LF_ASSERT_MSG((geo_ptr->DimGlobal() == 2) && (geo_ptr->DimLocal() == 2),
                "Only 2D implementation available!");
  // Matrix storing corner coordinates in its columns
  auto vertices = geo_ptr->Global(ref_el.NodeCoords());
  // Debugging output
  SPDLOG_LOGGER_TRACE(Logger(), "{}, shape={}", ref_el, vertices);

  // 4x4 dense matrix for returning result
  ElemMat elem_mat = ElemMat::Zero(4, 4);

  // Computations differ depending on the type of the cell
  switch (ref_el) {
    case lf::base::RefEl::kTria(): {
      // Triangular cell: straight edges assumed, which means that the triangle
      // is an affine image of the unit triangle and that the gradients of the
      // local shape functions (= barycentric coordinate functions) are
      // constant.
      LF_ASSERT_MSG((vertices.cols() == 3) && (vertices.rows() == 2),
                    "Wrong size of vertex matrix!");
      // Set up an auxiliary 3x3-matrix with a leading column 1 and
      // the vertex coordinates in its right 3x2 block
      Eigen::Matrix<double, 3, 3> X;  // temporary matrix
      X.block<3, 1>(0, 0) = Eigen::Vector3d::Ones();
      X.block<3, 2>(0, 1) = vertices.transpose();
      // The determinant of the auxliriary matrix also supplies the area
      const double area = 0.5 * std::abs(X.determinant());
      SPDLOG_LOGGER_TRACE(Logger(), "Area: {} <-> {}", area,
                          0.5 * geo_ptr->IntegrationElement(kTriabc));

      // Compute the gradients of the barycentric coordinate functions
      // and store them in the columns of a 2x3 matrix grad_bary_coords
      Eigen::Matrix<double, 2, 3> grad_bary_coords{
          X.inverse().block<2, 3>(1, 0)};
      // Since the gradients are constant local integration is easy
      elem_mat.block<3, 3>(0, 0) =
          area * grad_bary_coords.transpose() * grad_bary_coords;
      break;
    }
    case lf::base::RefEl::kQuad(): {
      LF_ASSERT_MSG((vertices.cols() == 4) && (vertices.rows() == 2),
                    "Wrong size of vertex matrix!");
      // Coefficient matrix for bilinear mapping to actual cell
      // clang-format off
      Eigen::Matrix<double, 2, 4> G(vertices *
                                    (Eigen::Matrix<double, 4, 4>() <<
				     1, -1, -1, 1,
				     0, 1 , 0, -1,
				     0, 0, 0, 1,
				     0, 0, 1, -1)
                                        .finished());
      // clang-format on 
      // Coefficients for the determinant as a linear function in
      // the reference coordinates
      // clang-format off
      Eigen::Vector3d detc{
          (Eigen::Vector3d() <<
	   G(0, 1) * G(1, 2) - G(1, 1) * G(0, 2),
           G(0, 1) * G(1, 3) - G(1, 1) * G(0, 3),
           G(1, 2) * G(0, 3) - G(0, 2) * G(1, 3))
              .finished()};
      // clang-format on
      // Determinant at a point in the reference element
      auto detDPhi = [&detc](const Eigen::Vector2d &xh) -> double {
        return std::abs(detc[0] + detc[1] * xh[0] + detc[2] * xh[1]);
      };
      SPDLOG_LOGGER_DEBUG(Logger(), "Determinant: {} <-> {}", detDPhi(kQuadpt),
                          geo_ptr->IntegrationElement(kQuadpt));

      // Transposed adjunct matrix of Jacobian of transformation
      auto DPhiadj =
          [&G](const Eigen::Vector2d &xh) -> Eigen::Matrix<double, 2, 2> {
        // clang-format off
        return ((Eigen::Matrix<double, 2, 2>() <<
		 G(1, 2) + G(1, 3) * xh[0] , -G(1, 1) - G(1, 3) * xh[1],
		 -G(0, 2) - G(0, 3) * xh[0], G(0, 1) + G(0, 3) * xh[1])
                    .finished());
        // clang-format on
      };
      // Output for debugging
      SPDLOG_LOGGER_TRACE(Logger(), "InverseTransposedJacobian:\n{} <-> {}",
                          (DPhiadj(kQuadpt) / detDPhi(kQuadpt)),
                          (geo_ptr->JacobianInverseGramian(kQuadpt)));

      // For a quadrilateral we have to use numerical quadrature based on
      // a 2-2 tensor-product Gauss rule.
      // Sum over quadrature points (weight= 0.5)
      for (int q = 0; q < 4; ++q) {
        // Obtain reference coordinates of current quadrature point
        const Eigen::Vector2d qp(kQuadPoints[q]);
        // Gradients of shape functions in quadrature points stored in
        // the columns of a matrix
        Eigen::Matrix<double, 2, 4> gradmat(DPhiadj(qp) *
                                            DervRefShapFncts(qp).transpose());
        // Update of element matrix by contribution from current quadrature
        // point, whose entries are dot products of gradients
        elem_mat += gradmat.transpose() * gradmat / detDPhi(qp);
      }
      // Scaling with quadrature weights
      elem_mat *= 0.25;
      break;
    }
    default: {
      LF_ASSERT_MSG(false, "Illegal cell type");
    }
  }  // end switch

  auto nv = vertices.cols();
  SPDLOG_LOGGER_TRACE(Logger(), "Element matrix\n{}",
                      elem_mat.block(0, 0, nv, nv));
  SPDLOG_LOGGER_TRACE(Logger(), "Row sums = {},\ncol sums = {}",
                      elem_mat.block(0, 0, nv, nv).colwise().sum(),
                      elem_mat.block(0, 0, nv, nv).rowwise().sum().transpose());

  // Return the element matrix
  return elem_mat;
}